

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

UCollationResult __thiscall
icu_63::RuleBasedCollator::compareUTF8
          (RuleBasedCollator *this,StringPiece *left,StringPiece *right,UErrorCode *errorCode)

{
  UCollationResult UVar1;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((((uint8_t *)left->ptr_ != (uint8_t *)0x0) || (left->length_ == 0)) &&
       (((uint8_t *)right->ptr_ != (uint8_t *)0x0 || (right->length_ == 0)))) {
      UVar1 = doCompare(this,(uint8_t *)left->ptr_,left->length_,(uint8_t *)right->ptr_,
                        right->length_,errorCode);
      return UVar1;
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return UCOL_EQUAL;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }